

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::NodeRecord::NodeRecord
          (NodeRecord *this,HasName *name,MultiLeaves *fields,LeafNames *fieldsNames,
          vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *dv)

{
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  SingleAttribute<avro::Name> *in_RDI;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe90;
  NoAttribute<int> *in_stack_fffffffffffffea8;
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb0;
  MultiAttribute<boost::shared_ptr<avro::Node>_> *in_stack_fffffffffffffeb8;
  ulong uVar4;
  undefined8 in_stack_fffffffffffffec8;
  format *msg;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar5;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *in_stack_fffffffffffffed8;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffef8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  ulong local_48;
  
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
              *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20),in_RDI,in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  *(undefined ***)&(in_RDI->attr_).ns_ = &PTR__NodeRecord_0030cc48;
  msg = (format *)((long)&in_RDI[2].attr_.simpleName_.field_2 + 8);
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_48 = 0;
  while( true ) {
    uVar4 = local_48;
    sVar2 = concepts::
            MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size((MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x244a1b);
    if (sVar2 <= uVar4) {
      return;
    }
    concepts::
    MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::get(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    bVar1 = concepts::
            NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::add(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (!bVar1) break;
    local_48 = local_48 + 1;
  }
  uVar5 = 1;
  uVar3 = __cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  this_00 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
            concepts::
            MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::get(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
            (this_00,in_stack_fffffffffffffe88);
  Exception::Exception((Exception *)CONCAT17(uVar5,in_stack_fffffffffffffed0),msg);
  __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

NodeRecord(const HasName &name, const MultiLeaves &fields,
        const LeafNames &fieldsNames,
        const std::vector<GenericDatum>& dv) :
        NodeImplRecord(AVRO_RECORD, name, fields, fieldsNames, NoSize()),
        defaultValues(dv) { 
        for (size_t i = 0; i < leafNameAttributes_.size(); ++i) {
            if (!nameIndex_.add(leafNameAttributes_.get(i), i)) {
                throw Exception(boost::format(
                    "Cannot add duplicate name: %1%") %
                    leafNameAttributes_.get(i));
            }
        }
    }